

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

char * __thiscall QTreeModel::index(QTreeModel *this,char *__s,int __c)

{
  int iVar1;
  ulong uVar2;
  qsizetype qVar3;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  QTreeWidgetItem *pQVar4;
  QTreeWidgetItem *pQVar5;
  long in_FS_OFFSET;
  QTreeWidgetItem *itm;
  long local_28;
  
  pQVar4 = (QTreeWidgetItem *)CONCAT44(in_register_00000014,__c);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  executePendingSort((QTreeModel *)__s);
  if ((pQVar4 == (QTreeWidgetItem *)0x0) || (*(QTreeWidgetItem **)(__s + 0x10) == pQVar4)) {
    *(undefined8 *)this = 0xffffffffffffffff;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      *(undefined8 *)&this->field_0x8 = 0;
      this->rootItem = (QTreeWidgetItem *)0x0;
      return (char *)this;
    }
  }
  else {
    pQVar5 = *(QTreeWidgetItem **)(__s + 0x10);
    if (pQVar4->par != (QTreeWidgetItem *)0x0) {
      pQVar5 = pQVar4->par;
    }
    iVar1 = pQVar4->d->rowGuess;
    uVar2 = (ulong)iVar1;
    itm = pQVar4;
    if ((((long)uVar2 < 0) || ((ulong)(pQVar5->children).d.size <= uVar2)) ||
       ((pQVar5->children).d.ptr[uVar2] != pQVar4)) {
      qVar3 = QtPrivate::lastIndexOf<QTreeWidgetItem*,QTreeWidgetItem*>(&pQVar5->children,&itm,-1);
      iVar1 = (int)qVar3;
      itm->d->rowGuess = iVar1;
    }
    *(int *)this = iVar1;
    *(undefined4 *)&this->field_0x4 = in_ECX;
    *(QTreeWidgetItem **)&this->field_0x8 = itm;
    this->rootItem = (QTreeWidgetItem *)__s;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return (char *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QTreeModel::index(const QTreeWidgetItem *item, int column) const
{
    executePendingSort();

    if (!item || (item == rootItem))
        return QModelIndex();
    const QTreeWidgetItem *par = item->parent();
    QTreeWidgetItem *itm = const_cast<QTreeWidgetItem*>(item);
    if (!par)
        par = rootItem;
    int row;
    int guess = item->d->rowGuess;
    if (guess >= 0
        && par->children.size() > guess
        && par->children.at(guess) == itm) {
        row = guess;
    } else {
        row = par->children.lastIndexOf(itm);
        itm->d->rowGuess = row;
    }
    return createIndex(row, column, itm);
}